

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O1

int Ifn_ManStrCheck2(char *pStr,int *pnInps,int *pnObjs)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  char *pcVar6;
  int *piVar7;
  int iVar8;
  int Marks [32];
  int local_98 [34];
  
  local_98[0x1c] = 0;
  local_98[0x1d] = 0;
  local_98[0x1e] = 0;
  local_98[0x1f] = 0;
  local_98[0x18] = 0;
  local_98[0x19] = 0;
  local_98[0x1a] = 0;
  local_98[0x1b] = 0;
  local_98[0x14] = 0;
  local_98[0x15] = 0;
  local_98[0x16] = 0;
  local_98[0x17] = 0;
  local_98[0x10] = 0;
  local_98[0x11] = 0;
  local_98[0x12] = 0;
  local_98[0x13] = 0;
  local_98[0xc] = 0;
  local_98[0xd] = 0;
  local_98[0xe] = 0;
  local_98[0xf] = 0;
  local_98[8] = 0;
  local_98[9] = 0;
  local_98[10] = 0;
  local_98[0xb] = 0;
  local_98[4] = 0;
  local_98[5] = 0;
  local_98[6] = 0;
  local_98[7] = 0;
  local_98[0] = 0;
  local_98[1] = 0;
  local_98[2] = 0;
  local_98[3] = 0;
  pcVar6 = pStr + 1;
  iVar5 = 0;
  do {
    bVar1 = pcVar6[-1];
    uVar4 = (ulong)bVar1;
    if (uVar4 < 0x3f) {
      if ((0x7800030000000000U >> (uVar4 & 0x3f) & 1) == 0) {
        if (uVar4 != 0) goto LAB_003bbada;
        pcVar6 = pStr + 1;
        iVar2 = 0;
        goto LAB_003bbb29;
      }
    }
    else {
LAB_003bbada:
      if (((0x22 < bVar1 - 0x5b) || ((0x500000005U >> ((ulong)(bVar1 - 0x5b) & 0x3f) & 1) == 0)) &&
         (0x19 < (byte)(bVar1 + 0xbf))) {
        uVar4 = (ulong)(char)bVar1;
        if (0x19 < (byte)(bVar1 + 0x9f)) break;
        if (*pcVar6 == '=') {
          local_98[(int)(char)bVar1 - 0x61] = 2;
          if (iVar5 <= (int)(bVar1 - 0x61)) {
            iVar5 = bVar1 - 0x61;
          }
        }
      }
    }
    pcVar6 = pcVar6 + 1;
  } while( true );
  pcVar6 = "String \"%s\" contains unrecognized symbol \'%c\'.\n";
  goto LAB_003bbc3c;
LAB_003bbb29:
  bVar1 = pcVar6[-1];
  uVar4 = (ulong)bVar1;
  if (uVar4 < 0x3f) {
    if ((0x7800030000000000U >> (uVar4 & 0x3f) & 1) == 0) {
      if (uVar4 != 0) goto LAB_003bbb3f;
      if (iVar5 < 0) goto LAB_003bbbaf;
      uVar4 = 0;
      goto LAB_003bbba0;
    }
  }
  else {
LAB_003bbb3f:
    if (((0x22 < bVar1 - 0x5b) || ((0x500000005U >> ((ulong)(bVar1 - 0x5b) & 0x3f) & 1) == 0)) &&
       (0x19 < (byte)(bVar1 + 0xbf))) {
      uVar4 = (ulong)(char)bVar1;
      if (0x19 < (byte)(bVar1 + 0x9f)) goto LAB_003bbc13;
      if ((*pcVar6 != '=') && (local_98[(int)(char)bVar1 - 0x61U] != 2)) {
        local_98[(int)(char)bVar1 - 0x61U] = 1;
        if (iVar2 <= (int)(bVar1 - 0x61)) {
          iVar2 = bVar1 - 0x61;
        }
      }
    }
  }
  pcVar6 = pcVar6 + 1;
  goto LAB_003bbb29;
  while (uVar4 = uVar4 + 1, iVar5 + 1U != uVar4) {
LAB_003bbba0:
    if (local_98[uVar4] == 0) {
      uVar4 = (ulong)((int)uVar4 + 0x61);
      pcVar6 = "String \"%s\" has no symbol \'%c\'.\n";
      goto LAB_003bbc3c;
    }
  }
LAB_003bbbaf:
  if (-1 < iVar2) {
    uVar4 = 0;
    do {
      if (local_98[uVar4] == 2) {
        uVar4 = (ulong)((int)uVar4 + 0x61);
        pcVar6 = "String \"%s\" has definition of input variable \'%c\'.\n";
        goto LAB_003bbc3c;
      }
      uVar4 = uVar4 + 1;
    } while (iVar2 + 1U != uVar4);
  }
  if (iVar2 < iVar5) {
    uVar3 = iVar2 + 0x62;
    piVar7 = local_98 + iVar2;
    do {
      uVar4 = (ulong)uVar3;
      piVar7 = piVar7 + 1;
      if (*piVar7 == 1) {
        pcVar6 = "String \"%s\" has no definition for internal variable \'%c\'.\n";
        goto LAB_003bbc3c;
      }
      iVar8 = uVar3 - iVar5;
      uVar3 = uVar3 + 1;
    } while (iVar8 != 0x61);
  }
  *pnInps = iVar2 + 1U;
  *pnObjs = iVar5 + 1U;
  return 1;
LAB_003bbc13:
  pcVar6 = "String \"%s\" contains unrecognized symbol \'%c\'.\n";
LAB_003bbc3c:
  Ifn_ErrorMessage(pcVar6,pStr,uVar4 & 0xffffffff);
  return 0;
}

Assistant:

int Ifn_ManStrCheck2( char * pStr, int * pnInps, int * pnObjs )
{
    int i, Marks[32] = {0}, MaxVar = 0, MaxDef = 0;
    for ( i = 0; pStr[i]; i++ )
    {
        if ( pStr[i] == '=' || pStr[i] == ';' || 
             pStr[i] == '(' || pStr[i] == ')' || 
             pStr[i] == '[' || pStr[i] == ']' || 
             pStr[i] == '<' || pStr[i] == '>' || 
             pStr[i] == '{' || pStr[i] == '}' )
            continue;
        if ( pStr[i] >= 'A' && pStr[i] <= 'Z' )
            continue;
        if ( pStr[i] >= 'a' && pStr[i] <= 'z' )
        {
            if ( pStr[i+1] == '=' )
                Marks[pStr[i] - 'a'] = 2, MaxDef = Abc_MaxInt(MaxDef, pStr[i] - 'a');
            continue;
        }
        return Ifn_ErrorMessage( "String \"%s\" contains unrecognized symbol \'%c\'.\n", pStr, pStr[i] );
    }
    for ( i = 0; pStr[i]; i++ )
    {
        if ( pStr[i] == '=' || pStr[i] == ';' || 
             pStr[i] == '(' || pStr[i] == ')' || 
             pStr[i] == '[' || pStr[i] == ']' || 
             pStr[i] == '<' || pStr[i] == '>' || 
             pStr[i] == '{' || pStr[i] == '}' )
            continue;
        if ( pStr[i] >= 'A' && pStr[i] <= 'Z' )
            continue;
        if ( pStr[i] >= 'a' && pStr[i] <= 'z' )
        {
            if ( pStr[i+1] != '=' && Marks[pStr[i] - 'a'] != 2 )
                Marks[pStr[i] - 'a'] = 1, MaxVar = Abc_MaxInt(MaxVar, pStr[i] - 'a');
            continue;
        }
        return Ifn_ErrorMessage( "String \"%s\" contains unrecognized symbol \'%c\'.\n", pStr, pStr[i] );
    }
    MaxVar++;
    MaxDef++;
    for ( i = 0; i < MaxDef; i++ )
        if ( Marks[i] == 0 )
            return Ifn_ErrorMessage( "String \"%s\" has no symbol \'%c\'.\n", pStr, 'a' + i );
    for ( i = 0; i < MaxVar; i++ )
        if ( Marks[i] == 2 )
            return Ifn_ErrorMessage( "String \"%s\" has definition of input variable \'%c\'.\n", pStr, 'a' + i );
    for ( i = MaxVar; i < MaxDef; i++ )
        if ( Marks[i] == 1 )
            return Ifn_ErrorMessage( "String \"%s\" has no definition for internal variable \'%c\'.\n", pStr, 'a' + i );
    *pnInps = MaxVar;
    *pnObjs = MaxDef;
    return 1;
}